

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Yolov3DetectionOutput_x86::forward
          (Yolov3DetectionOutput_x86 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  undefined8 uVar2;
  size_t sVar3;
  void *pvVar4;
  ulong uVar5;
  Mat *this_00;
  uint uVar6;
  undefined1 auVar7 [12];
  int iVar8;
  float *pfVar9;
  ulong uVar10;
  ulong uVar11;
  _func_int *p_Var12;
  pointer pBVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  float *pfVar18;
  ulong uVar19;
  long lVar20;
  pointer pMVar21;
  float *pfVar22;
  int i;
  float *pfVar23;
  int iVar24;
  long lVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar33;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar32 [16];
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  float *local_170;
  float *local_168;
  int local_160;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  float fStack_50;
  float fStack_4c;
  
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar19 = 0;
  do {
    if ((ulong)(((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start) / 0x48) <= uVar19) {
      Yolov3DetectionOutput::qsort_descent_inplace
                ((Yolov3DetectionOutput *)
                 ((long)&this->_vptr_Yolov3DetectionOutput_x86 +
                 (long)this->_vptr_Yolov3DetectionOutput_x86[-3]),&all_bbox_rects);
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0.0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = 0.0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0.0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0.0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0.0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0.0;
      Yolov3DetectionOutput::nms_sorted_bboxes
                ((Yolov3DetectionOutput *)
                 ((long)&this->_vptr_Yolov3DetectionOutput_x86 +
                 (long)this->_vptr_Yolov3DetectionOutput_x86[-3]),&all_bbox_rects,&picked,
                 *(float *)(&this->field_0xdc + (long)this->_vptr_Yolov3DetectionOutput_x86[-3]));
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (uVar19 = 0;
          uVar19 < (ulong)(CONCAT44(picked.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                    picked.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish._0_4_) -
                           CONCAT44(picked.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    picked.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_4_) >> 3);
          uVar19 = uVar19 + 1) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
        ::push_back(&bbox_rects,
                    all_bbox_rects.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                    *(long *)(CONCAT44(picked.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       picked.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + uVar19 * 8
                             ));
      }
      uVar19 = ((long)bbox_rects.
                      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)bbox_rects.
                     super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x1c;
      iVar24 = (int)uVar19;
      if (iVar24 == 0) {
        iVar8 = 0;
      }
      else {
        this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        Mat::create(this_00,6,iVar24,4,opt->blob_allocator);
        pvVar4 = this_00->data;
        iVar8 = -100;
        if ((pvVar4 != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          iVar8 = 0;
          uVar19 = uVar19 & 0xffffffff;
          if (iVar24 < 1) {
            uVar19 = 0;
          }
          pBVar13 = bbox_rects.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
            fVar35 = pBVar13->score;
            lVar20 = (long)this_00->w * uVar16 * this_00->elemsize;
            *(float *)((long)pvVar4 + lVar20) = (float)pBVar13->label + 1.0;
            *(float *)((long)pvVar4 + lVar20 + 4) = fVar35;
            *(float *)((long)pvVar4 + lVar20 + 8) = pBVar13->xmin;
            *(float *)((long)pvVar4 + lVar20 + 0xc) = pBVar13->ymin;
            *(float *)((long)pvVar4 + lVar20 + 0x10) = pBVar13->xmax;
            *(float *)((long)pvVar4 + lVar20 + 0x14) = pBVar13->ymax;
            pBVar13 = pBVar13 + 1;
          }
        }
      }
      std::
      _Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ::~_Vector_base(&bbox_rects.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     );
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
LAB_003ed89d:
      std::
      _Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ::~_Vector_base(&all_bbox_rects.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     );
      return iVar8;
    }
    bbox_rects.
    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bbox_rects.
    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    bbox_rects.
    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              *)&bbox_rects,
             (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_Yolov3DetectionOutput_x86[-3]));
    pMVar21 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    p_Var12 = this->_vptr_Yolov3DetectionOutput_x86[-3];
    iVar24 = *(int *)(&this->field_0xd4 + (long)p_Var12);
    iVar8 = pMVar21[uVar19].c / iVar24;
    if (iVar8 != *(int *)(&this->field_0xd0 + (long)p_Var12) + 5) {
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                 *)&bbox_rects);
      iVar8 = -1;
      goto LAB_003ed89d;
    }
    pMVar21 = pMVar21 + uVar19;
    lVar20 = (long)iVar24;
    uVar16._0_4_ = pMVar21->w;
    uVar16._4_4_ = pMVar21->h;
    auVar36._0_4_ = (float)(int)(undefined4)uVar16;
    auVar36._4_4_ = (float)(int)uVar16._4_4_;
    fVar35 = *(float *)(*(long *)(&this->field_0x170 + (long)p_Var12) + uVar19 * 4);
    fVar34 = (float)(int)(fVar35 * auVar36._0_4_);
    fVar35 = (float)(int)(fVar35 * auVar36._4_4_);
    uVar14 = 0;
    if (0 < (int)(undefined4)uVar16) {
      uVar14 = uVar16 & 0xffffffff;
    }
    auVar32._4_4_ = uVar16._4_4_;
    auVar32._0_4_ = uVar16._4_4_;
    auVar32._8_4_ = uVar16._4_4_;
    auVar32._12_4_ = uVar16._4_4_;
    uVar6 = uVar16._4_4_;
    if ((int)uVar16._4_4_ < 1) {
      uVar6 = 0;
    }
    auVar36._8_8_ = 0x3f0000003f000000;
    auVar32 = rcpps(auVar32,auVar36);
    fVar26 = auVar32._0_4_;
    fVar33 = auVar32._4_4_;
    for (lVar15 = 0; lVar15 < iVar24; lVar15 = lVar15 + 1) {
      lVar17 = lVar15 * iVar8;
      sVar3 = pMVar21->cstep;
      pvVar4 = pMVar21->data;
      uVar5 = pMVar21->elemsize;
      uVar2 = *(undefined8 *)
               (*(long *)(&this->field_0xe0 + (long)p_Var12) +
               (long)((int)*(float *)(*(long *)(&this->field_0x128 + (long)p_Var12) +
                                      lVar20 * uVar19 * 4 + lVar15 * 4) * 2) * 4);
      pfVar18 = (float *)(sVar3 * lVar17 * uVar5 + (long)pvVar4);
      pfVar23 = (float *)((lVar17 + 1) * sVar3 * uVar5 + (long)pvVar4);
      local_168 = (float *)((lVar17 + 2) * sVar3 * uVar5 + (long)pvVar4);
      local_170 = (float *)((lVar17 + 3) * sVar3 * uVar5 + (long)pvVar4);
      pfVar22 = (float *)((lVar17 + 4) * sVar3 * uVar5 + (long)pvVar4);
      lVar25 = (long)(int)(((long)pMVar21->d * uVar5 * (long)pMVar21->h * (long)pMVar21->w + 0xf &
                           0xfffffffffffffff0) / uVar5);
      for (uVar11 = 0; uVar11 != uVar6; uVar11 = uVar11 + 1) {
        for (uVar10 = 0; uVar10 != uVar14; uVar10 = uVar10 + 1) {
          pfVar9 = (float *)((long)pvVar4 +
                            uVar10 * 4 +
                            uVar11 * (long)(int)(undefined4)uVar16 * 4 +
                            (lVar17 + 5) * sVar3 * uVar5);
          p_Var12 = this->_vptr_Yolov3DetectionOutput_x86[-3];
          pfVar1 = pfVar9 + *(int *)(&this->field_0xd0 + (long)p_Var12) * lVar25;
          fVar28 = -3.4028235e+38;
          for (; pfVar9 < pfVar1; pfVar9 = pfVar9 + lVar25) {
            if (fVar28 <= *pfVar9) {
              fVar28 = *pfVar9;
            }
          }
          fVar27 = expf(-*pfVar22);
          fVar28 = expf(-fVar28);
          fVar28 = 1.0 / ((fVar28 + 1.0) * fVar27 + 1.0);
          if (*(float *)(&this->field_0xd8 + (long)p_Var12) <= fVar28) {
            fVar27 = *pfVar23;
            auVar32 = ZEXT416((uint)fVar27);
            fVar29 = expf(-*pfVar18);
            fVar27 = expf(-fVar27);
            fVar30 = expf(*local_168);
            fVar31 = expf(*local_170);
            auVar40._4_4_ = fVar27 + 1.0;
            auVar40._0_4_ = fVar29 + 1.0;
            auVar40._8_4_ = extraout_XMM0_Db + 0.0;
            auVar40._12_4_ = extraout_XMM0_Db_00 + 0.0;
            auVar32 = rcpps(auVar32,auVar40);
            fStack_50 = (float)uVar2;
            fStack_4c = (float)((ulong)uVar2 >> 0x20);
            auVar39._0_4_ = auVar32._0_4_ * 1.0;
            auVar39._4_4_ = auVar32._4_4_ * 1.0;
            auVar39._8_4_ = fStack_50 * auVar32._8_4_;
            auVar39._12_4_ = fStack_4c * auVar32._12_4_;
            auVar7._4_8_ = auVar32._8_8_;
            auVar7._0_4_ = (float)(int)uVar11;
            auVar37._0_8_ = auVar7._0_8_ << 0x20;
            auVar37._8_4_ = fVar34;
            auVar37._12_4_ = fVar35;
            local_160 = (int)uVar10;
            auVar38._4_12_ = auVar37._4_12_;
            auVar38._0_4_ = (float)local_160;
            auVar40 = rcpps(auVar39,auVar38);
            fVar41 = fVar30 * fStack_50 * auVar40._8_4_;
            fVar42 = fVar31 * fStack_4c * auVar40._12_4_;
            fVar41 = (fVar30 * fStack_50 - fVar34 * fVar41) * auVar40._8_4_ + fVar41;
            fVar42 = (fVar31 * fStack_4c - fVar35 * fVar42) * auVar40._12_4_ + fVar42;
            fVar29 = ((1.0 - (fVar29 + 1.0) * auVar39._0_4_) * auVar32._0_4_ + auVar39._0_4_ +
                     auVar38._0_4_) * ((1.0 - auVar36._0_4_ * fVar26) * fVar26 + fVar26);
            fVar27 = ((1.0 - (fVar27 + 1.0) * auVar39._4_4_) * auVar32._4_4_ + auVar39._4_4_ +
                     (float)(int)uVar11) * ((1.0 - auVar36._4_4_ * fVar33) * fVar33 + fVar33);
            fVar30 = fVar41 * 0.5;
            fVar31 = fVar42 * 0.5;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ = fVar29 - fVar30;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish._0_4_ = fVar27 - fVar31;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish._4_4_ = fVar29 + fVar30;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = fVar27 + fVar31;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = fVar41 * fVar42;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = fVar28;
            std::
            vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ::push_back((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         *)(&(bbox_rects.
                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                              ._M_impl.super__Vector_impl_data._M_start)->score + lVar15 * 6),
                        (value_type *)&picked);
          }
          pfVar18 = pfVar18 + 1;
          pfVar23 = pfVar23 + 1;
          local_168 = local_168 + 1;
          local_170 = local_170 + 1;
          pfVar22 = pfVar22 + 1;
        }
      }
      p_Var12 = this->_vptr_Yolov3DetectionOutput_x86[-3];
      iVar24 = *(int *)(&this->field_0xd4 + (long)p_Var12);
    }
    lVar20 = 8;
    for (lVar15 = 0; lVar15 < *(int *)(&this->field_0xd4 + (long)p_Var12); lVar15 = lVar15 + 1) {
      std::
      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
      ::
      insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>,void>
                ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                  *)&all_bbox_rects,
                 (const_iterator)
                 all_bbox_rects.
                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 *(BBoxRect **)
                  ((long)bbox_rects.
                         super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar20 + -8),
                 *(BBoxRect **)
                  ((long)&(bbox_rects.
                           super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                           ._M_impl.super__Vector_impl_data._M_start)->score + lVar20));
      p_Var12 = this->_vptr_Yolov3DetectionOutput_x86[-3];
      lVar20 = lVar20 + 0x18;
    }
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
               *)&bbox_rects);
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

int Yolov3DetectionOutput_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = (int)scores.cstep;

#if __AVX2__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + expf(-box_score_ptr[0]) * (1.f + expf(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = expf(wptr[0]) * bias_w / net_w;
                        float bbox_h = expf(hptr[0]) * bias_h / net_h;

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = r.label + 1.0f; // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}